

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signed-interest.c
# Opt level: O1

int ndn_signed_interest_digest_verify(ndn_interest_t *interest)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  undefined1 uVar5;
  void *pvVar4;
  int iVar6;
  name_component_t *component;
  int iVar7;
  bool bVar8;
  undefined1 local_2e8 [8];
  uint8_t be_signed [680];
  uint32_t uStack_34;
  
  uVar3 = 0xffffffef;
  if (-1 < (char)interest->flags) {
    return -0x11;
  }
  if ((interest->name).components[(ulong)(interest->name).components_size - 1].type == 2) {
    memset(local_2e8,0,0x2a8);
    pvVar4 = memset(local_2e8,0,0x2a8);
    uVar3 = (uint)pvVar4;
    uStack_34 = 0;
    bVar8 = 1 < (interest->name).components_size;
    be_signed._672_8_ = local_2e8;
    if ((bVar8) &&
       (uVar3 = name_component_tlv_encode
                          ((ndn_encoder_t *)(be_signed + 0x2a0),(name_component_t *)interest),
       uVar3 == 0)) {
      component = (interest->name).components;
      iVar7 = 0;
      do {
        component = component + 1;
        iVar6 = (interest->name).components_size - 1;
        iVar7 = iVar7 + 1;
        bVar8 = iVar7 < iVar6;
        if (iVar6 <= iVar7) break;
        uVar3 = name_component_tlv_encode((ndn_encoder_t *)(be_signed + 0x2a0),component);
      } while (uVar3 == 0);
    }
    if (!bVar8) {
      if ((interest->flags & 0x40) != 0) {
        *(undefined1 *)be_signed._672_8_ = 0x24;
        uVar3 = 1;
        uVar2 = (interest->parameters).size;
        if (uVar2 < 0xfd) {
          iVar7 = 1;
        }
        else {
          uVar5 = (undefined1)(uVar2 >> 8);
          if (uVar2 < 0x10000) {
            *(undefined1 *)(be_signed._672_8_ + 1) = 0xfd;
            *(undefined1 *)(be_signed._672_8_ + 2) = uVar5;
            uVar3 = 3;
            iVar7 = 3;
          }
          else {
            *(undefined1 *)(be_signed._672_8_ + 1) = 0xfe;
            *(char *)(be_signed._672_8_ + 2) = (char)(uVar2 >> 0x18);
            *(char *)(be_signed._672_8_ + 3) = (char)(uVar2 >> 0x10);
            *(undefined1 *)(be_signed._672_8_ + 4) = uVar5;
            uVar3 = 5;
            iVar7 = 5;
          }
        }
        *(char *)(be_signed._672_8_ + (ulong)uVar3) = (char)uVar2;
        uVar3 = iVar7 + 1;
        uVar2 = (interest->parameters).size;
        if ((int)(0x2a8 - uVar3) < (int)uVar2) {
          return -10;
        }
        memcpy((void *)((ulong)uVar3 + be_signed._672_8_),&interest->parameters,(ulong)uVar2);
        uStack_34 = uVar3 + uVar2;
      }
      uVar3 = ndn_signature_info_tlv_encode
                        ((ndn_encoder_t *)(be_signed + 0x2a0),&interest->signature);
      if (((uVar3 == 0) &&
          (uVar3 = ndn_signature_value_tlv_encode
                             ((ndn_encoder_t *)(be_signed + 0x2a0),&interest->signature), uVar3 == 0
          )) && (uVar3 = ndn_sha256_verify((uint8_t *)be_signed._672_8_,uStack_34,
                                           (interest->signature).sig_value,
                                           (interest->signature).sig_size), -1 < (int)uVar3)) {
        bVar1 = (interest->name).components_size;
        iVar7 = ndn_sha256_verify((uint8_t *)be_signed._672_8_,uStack_34,
                                  (interest->name).components[(ulong)bVar1 - 1].value,
                                  (uint)(interest->name).components[(ulong)bVar1 - 1].size);
        uVar3 = iVar7 >> 0x1f & 0xffffffe2;
      }
    }
  }
  return uVar3;
}

Assistant:

int
ndn_signed_interest_digest_verify(const ndn_interest_t* interest)
{
  // check the signed Interest format
  if (!ndn_interest_is_signed(interest) ||
      interest->name.components[interest->name.components_size - 1].type != TLV_ParametersSha256DigestComponent) {
    return NDN_UNSUPPORTED_FORMAT;
  }
  int ret_val = -1;
  uint8_t be_signed[NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE] = {0};
  ndn_encoder_t temp_encoder;
  encoder_init(&temp_encoder, be_signed, NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE);

  // the signing input starts at Name's Value (V)
  for (uint8_t i = 0; i < interest->name.components_size - 1; i++) {
    ret_val = name_component_tlv_encode(&temp_encoder, &interest->name.components[i]);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  // the digest input starts at parameters
  uint32_t param_block_starting = temp_encoder.offset;
  if (ndn_interest_has_Parameters(interest)) {
    ret_val = encoder_append_type(&temp_encoder, TLV_ApplicationParameters);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(&temp_encoder, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(&temp_encoder, interest->parameters.value, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  ret_val = ndn_signature_info_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;
  // the signing input ends at signature info
  uint32_t siginfo_block_ending = temp_encoder.offset;
  ret_val = ndn_signature_value_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;

  int result = ndn_sha256_verify(temp_encoder.output_value, siginfo_block_ending,
                                 interest->signature.sig_value, interest->signature.sig_size);

  if (result < 0)
    return result;

  result = ndn_sha256_verify(&temp_encoder.output_value[param_block_starting],
                             temp_encoder.offset - param_block_starting,
                             interest->name.components[interest->name.components_size - 1].value,
                             interest->name.components[interest->name.components_size - 1].size);
  if (result < 0)
    return NDN_SEC_SIGNED_INTEREST_INVALID_DIGEST;
  return NDN_SUCCESS;
}